

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O3

HT_Boolean
ht_tcp_server_start(HT_TCPServer *server,int port,OnClientConnected client_connected_cb,
                   void *user_data)

{
  int iVar1;
  HT_Thread *pHVar2;
  int optval;
  thread local_58;
  undefined4 local_4c;
  HT_TCPServer *local_48;
  _func_void_ptr_void_ptr *local_40;
  sockaddr local_38;
  
  if (server->server_sock_fd != -1) {
    ht_tcp_server_stop(server);
  }
  iVar1 = socket(2,1,0);
  server->server_sock_fd = iVar1;
  if (-1 < iVar1) {
    local_4c = 1;
    iVar1 = setsockopt(iVar1,1,2,&local_4c,4);
    if (iVar1 == 0) {
      local_38.sa_data[6] = '\0';
      local_38.sa_data[7] = '\0';
      local_38.sa_data[8] = '\0';
      local_38.sa_data[9] = '\0';
      local_38.sa_data[10] = '\0';
      local_38.sa_data[0xb] = '\0';
      local_38.sa_data[0xc] = '\0';
      local_38.sa_data[0xd] = '\0';
      local_38.sa_family = 2;
      local_38.sa_data[2] = '\0';
      local_38.sa_data[3] = '\0';
      local_38.sa_data[4] = '\0';
      local_38.sa_data[5] = '\0';
      local_38.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
      iVar1 = bind(server->server_sock_fd,&local_38,0x10);
      if ((-1 < iVar1) && (iVar1 = listen(server->server_sock_fd,5), -1 < iVar1)) {
        server->client_connected_cb = client_connected_cb;
        server->client_connected_ud = user_data;
        local_40 = _ht_tcp_server_run;
        local_48 = server;
        pHVar2 = (HT_Thread *)ht_alloc(8);
        (pHVar2->th)._M_id._M_thread = 0;
        std::thread::thread<void*(*&)(void*),void*&,void>(&local_58,&local_40,&local_48);
        if ((pHVar2->th)._M_id._M_thread == 0) {
          (pHVar2->th)._M_id._M_thread = (native_handle_type)local_58._M_id._M_thread;
          server->accept_client_thread = pHVar2;
          return 1;
        }
        std::terminate();
      }
    }
    ht_tcp_server_stop(server);
  }
  return 0;
}

Assistant:

HT_Boolean
ht_tcp_server_start(HT_TCPServer* server, int port, OnClientConnected client_connected_cb, void* user_data)
{
    if (ht_tcp_server_is_running(server))
    {
        ht_tcp_server_stop(server);
    }
#ifdef _WIN32
    WSADATA wsaData;
    if (WSAStartup(MAKEWORD(2, 2), &wsaData) != 0)
    {
        return HT_FALSE;
    }
#endif
    server->server_sock_fd = socket(AF_INET, SOCK_STREAM, 0);

    if (server->server_sock_fd < 0)
    {
        return HT_FALSE;
    }

#ifndef _WIN32
    int optval = 1;
    if (setsockopt(server->server_sock_fd, SOL_SOCKET, SO_REUSEADDR, (const void *)&optval , sizeof(int)) != 0)
    {
        ht_tcp_server_stop(server);
        return HT_FALSE;
    }
#endif

    struct sockaddr_in serveraddr;
    memset((char *) &serveraddr, 0, sizeof(serveraddr));
    serveraddr.sin_family = AF_INET;
    serveraddr.sin_addr.s_addr = htonl(INADDR_ANY);
    serveraddr.sin_port = htons((unsigned short)port);

    if (bind(server->server_sock_fd, (struct sockaddr *) &serveraddr, sizeof(serveraddr)) < 0)
    {
        ht_tcp_server_stop(server);
        return HT_FALSE;
    }

    if (listen(server->server_sock_fd, 5) < 0)
    {
        ht_tcp_server_stop(server);
        return HT_FALSE;
    }

    server->client_connected_cb = client_connected_cb;
    server->client_connected_ud = user_data;
    server->accept_client_thread = ht_thread_create(_ht_tcp_server_run, server);

    return HT_TRUE;
}